

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

Beats __thiscall ableton::link::phase(link *this,Beats *beats,Beats *quantum)

{
  bool bVar1;
  int64_t iVar2;
  _Head_base<0UL,_long,_false> local_60;
  Beats local_58;
  _Head_base<0UL,_long,_false> local_50;
  Beats local_48;
  long local_40;
  int64_t quantumBeats;
  longlong quantumBins;
  int64_t quantumMicros;
  Beats *local_20;
  Beats *quantum_local;
  Beats *beats_local;
  
  local_20 = quantum;
  quantum_local = beats;
  beats_local = (Beats *)this;
  Beats::Beats((Beats *)&quantumMicros,0);
  bVar1 = std::operator==(&quantum->super_tuple<long>,(tuple<long> *)&quantumMicros);
  if (bVar1) {
    Beats::Beats((Beats *)this,0);
  }
  else {
    quantumBins = Beats::microBeats(quantum);
    iVar2 = Beats::microBeats(beats);
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    quantumBeats = (iVar2 + quantumBins) / quantumBins;
    local_40 = quantumBeats * quantumBins;
    local_50._M_head_impl =
         (beats->super_tuple<long>).super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>.
         _M_head_impl;
    Beats::Beats(&local_58,local_40);
    operator+((link *)&local_48,(Beats *)&local_50,&local_58);
    local_60._M_head_impl =
         (quantum->super_tuple<long>).super__Tuple_impl<0UL,_long>.
         super__Head_base<0UL,_long,_false>._M_head_impl;
    operator%(this,&local_48,(Beats *)&local_60);
  }
  return (tuple<long>)(tuple<long>)this;
}

Assistant:

inline Beats phase(const Beats beats, const Beats quantum)
{
  if (quantum == Beats{INT64_C(0)})
  {
    return Beats{INT64_C(0)};
  }
  else
  {
    // Handle negative beat values by doing the computation relative to an
    // origin that is on the nearest quantum boundary less than -(abs(x))
    const auto quantumMicros = quantum.microBeats();
    const auto quantumBins = (llabs(beats.microBeats()) + quantumMicros) / quantumMicros;
    const std::int64_t quantumBeats{quantumBins * quantumMicros};
    return (beats + Beats{quantumBeats}) % quantum;
  }
}